

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeSplitLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  int iVar1;
  RepeatedPtrFieldBase *this_00;
  LogMessage *pLVar2;
  mapped_type *this_01;
  LayerUnion LVar3;
  Type *pTVar4;
  mapped_type *pmVar5;
  ShapeRange *pSVar6;
  int iVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_02;
  NonlinearityTypeUnion NVar8;
  LogFinisher local_79;
  NonlinearityTypeUnion local_78;
  RepeatedPtrFieldBase *local_70;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_02 = &this->blobShapes;
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_02,(key_type *)
                                 ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if (specLayer->_oneof_case_[0] == 0x14a) {
    LVar3 = specLayer->layer_;
  }
  else {
    LVar3.split_ = Specification::SplitLayerParams::default_instance();
  }
  NVar8 = (LVar3.activation_)->NonlinearityType_;
  if (0 < (specLayer->output_).super_RepeatedPtrFieldBase.current_size_) {
    local_70 = &(specLayer->output_).super_RepeatedPtrFieldBase;
    iVar7 = 0;
    local_78 = (LVar3.activation_)->NonlinearityType_;
    do {
      this_00 = local_70;
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (local_70,iVar7);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](this_02,pTVar4);
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (this_00,iVar7);
      ShapeConstraint::setName(pmVar5,pTVar4);
      pSVar6 = ShapeConstraint::sequenceRange(this_01);
      ShapeConstraint::updateSequenceRange(pmVar5,pSVar6);
      pSVar6 = ShapeConstraint::batchRange(this_01);
      ShapeConstraint::updateBatchRange(pmVar5,pSVar6);
      pSVar6 = ShapeConstraint::channelRange(this_01);
      ShapeRange::operator/((ShapeRange *)&local_68,pSVar6,local_78._0_4_);
      ShapeConstraint::updateChannelRange(pmVar5,(ShapeRange *)&local_68);
      pSVar6 = ShapeConstraint::heightRange(this_01);
      ShapeConstraint::updateHeightRange(pmVar5,pSVar6);
      pSVar6 = ShapeConstraint::widthRange(this_01);
      ShapeConstraint::updateWidthRange(pmVar5,pSVar6);
      iVar7 = iVar7 + 1;
      iVar1 = (specLayer->output_).super_RepeatedPtrFieldBase.current_size_;
    } while (iVar7 < iVar1);
    iVar7 = local_78._0_4_;
    NVar8 = local_78;
    if (0 < iVar1) goto LAB_002776c4;
  }
  iVar7 = NVar8._0_4_;
  google::protobuf::internal::LogMessage::LogMessage
            (&local_68,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
             ,0x5ca);
  pLVar2 = google::protobuf::internal::LogMessage::operator<<
                     (&local_68,"CHECK failed: (index) < (current_size_): ");
  google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar2);
  google::protobuf::internal::LogMessage::~LogMessage(&local_68);
LAB_002776c4:
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_02,(key_type *)
                                ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  pSVar6 = ShapeConstraint::sequenceRange(pmVar5);
  ShapeConstraint::updateSequenceRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::batchRange(pmVar5);
  ShapeConstraint::updateBatchRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::channelRange(pmVar5);
  ShapeRange::operator*((ShapeRange *)&local_68,pSVar6,(long)iVar7);
  ShapeConstraint::updateChannelRange(this_01,(ShapeRange *)&local_68);
  pSVar6 = ShapeConstraint::heightRange(pmVar5);
  ShapeConstraint::updateHeightRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::widthRange(pmVar5);
  ShapeConstraint::updateWidthRange(this_01,pSVar6);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSplitLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif

    int nout = static_cast<int>(specLayer.split().noutputs());

    for (int i = 0; i < specLayer.output_size(); i++) {

        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));

        outputShape.updateSequenceRange(inputShape.sequenceRange());
        outputShape.updateBatchRange(inputShape.batchRange());
        outputShape.updateChannelRange(inputShape.channelRange() / nout);
        outputShape.updateHeightRange(inputShape.heightRange());
        outputShape.updateWidthRange(inputShape.widthRange());

    }
    
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange() * static_cast<size_t>(nout));
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif


}